

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

int run_test_poll_bad_fdtype(void)

{
  long ******pppppplVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  undefined8 uVar5;
  ulong uVar6;
  connection_context_t *pcVar7;
  long ******pppppplVar8;
  ssize_t sVar9;
  int *piVar10;
  uint extraout_EDX;
  uint uVar11;
  code *__n;
  char *pcVar12;
  undefined4 uVar13;
  long *plVar14;
  long *plVar15;
  code **ppcVar16;
  long *****ppppplVar17;
  long ******pppppplVar18;
  long ******pppppplVar19;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_poll_t poll_handle;
  code *pcStack_238;
  undefined8 uStack_230;
  long lStack_228;
  long *****ppppplStack_220;
  code *pcStack_218;
  long *****ppppplStack_210;
  long *****ppppplStack_208;
  long *****ppppplStack_200;
  long *****ppppplStack_1f8;
  undefined8 uStack_1c8;
  long ****pppplStack_1c0;
  long *****ppppplStack_1b8;
  undefined8 uStack_198;
  long lStack_190;
  socklen_t sStack_184;
  sockaddr sStack_180;
  code *pcStack_170;
  undefined8 uStack_160;
  long lStack_158;
  undefined4 uStack_14c;
  undefined1 *puStack_148;
  long *plStack_140;
  code *pcStack_138;
  long lStack_130;
  long lStack_128;
  long alStack_120 [16];
  code *pcStack_a0;
  long local_98;
  long local_90;
  long local_88 [16];
  
  pcStack_a0 = (code *)0x1b5cbd;
  uVar2 = open64(".",0);
  uVar6 = (ulong)uVar2;
  local_88[0] = (long)(int)uVar2;
  local_98 = -1;
  if (local_88[0] == -1) {
    pcStack_a0 = (code *)0x1b5d97;
    run_test_poll_bad_fdtype_cold_4();
LAB_001b5d97:
    pcStack_a0 = (code *)0x1b5da4;
    run_test_poll_bad_fdtype_cold_3();
LAB_001b5da4:
    pcStack_a0 = (code *)0x1b5db1;
    run_test_poll_bad_fdtype_cold_1();
  }
  else {
    local_98 = 0;
    pcStack_a0 = (code *)0x1b5cea;
    uVar5 = uv_default_loop();
    pcStack_a0 = (code *)0x1b5cf9;
    iVar3 = uv_poll_init(uVar5,local_88,uVar6);
    local_90 = (long)iVar3;
    if (local_98 == local_90) goto LAB_001b5d97;
    pcStack_a0 = (code *)0x1b5d16;
    iVar3 = close(uVar2);
    local_98 = (long)iVar3;
    local_90 = 0;
    if (local_98 != 0) goto LAB_001b5da4;
    pcStack_a0 = (code *)0x1b5d35;
    uVar6 = uv_default_loop();
    pcStack_a0 = (code *)0x1b5d49;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_a0 = (code *)0x1b5d53;
    uv_run(uVar6,0);
    local_98 = 0;
    pcStack_a0 = (code *)0x1b5d60;
    uVar5 = uv_default_loop();
    pcStack_a0 = (code *)0x1b5d68;
    iVar3 = uv_loop_close(uVar5);
    local_90 = (long)iVar3;
    if (local_98 == local_90) {
      pcStack_a0 = (code *)0x1b5d7f;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_a0 = run_test_poll_nested_epoll;
  run_test_poll_bad_fdtype_cold_2();
  plVar15 = &lStack_130;
  pcStack_138 = (code *)0x1b5dd0;
  pcStack_a0 = (code *)uVar6;
  uVar2 = epoll_create(1);
  uVar6 = (ulong)uVar2;
  alStack_120[0] = (long)(int)uVar2;
  lStack_130 = -1;
  if (alStack_120[0] == -1) {
    pcStack_138 = (code *)0x1b5f4b;
    run_test_poll_nested_epoll_cold_7();
LAB_001b5f4b:
    pcStack_138 = (code *)0x1b5f58;
    run_test_poll_nested_epoll_cold_1();
LAB_001b5f58:
    pcStack_138 = (code *)0x1b5f65;
    run_test_poll_nested_epoll_cold_2();
LAB_001b5f65:
    pcStack_138 = (code *)0x1b5f72;
    run_test_poll_nested_epoll_cold_6();
LAB_001b5f72:
    pcStack_138 = (code *)0x1b5f7f;
    run_test_poll_nested_epoll_cold_3();
LAB_001b5f7f:
    pcStack_138 = (code *)0x1b5f8c;
    run_test_poll_nested_epoll_cold_4();
  }
  else {
    pcStack_138 = (code *)0x1b5df5;
    uVar5 = uv_default_loop();
    pcStack_138 = (code *)0x1b5e04;
    iVar3 = uv_poll_init(uVar5,alStack_120,uVar6);
    lStack_130 = (long)iVar3;
    lStack_128 = 0;
    if (lStack_130 != 0) goto LAB_001b5f4b;
    pcStack_138 = (code *)0x1b5e38;
    iVar3 = uv_poll_start(alStack_120,1,abort);
    lStack_130 = (long)iVar3;
    lStack_128 = 0;
    if (lStack_130 != 0) goto LAB_001b5f58;
    lStack_130 = 0;
    pcStack_138 = (code *)0x1b5e63;
    uVar5 = uv_default_loop();
    pcStack_138 = (code *)0x1b5e70;
    iVar3 = uv_run(uVar5,2);
    lStack_128 = (long)iVar3;
    if (lStack_130 == lStack_128) goto LAB_001b5f65;
    pcStack_138 = (code *)0x1b5e92;
    uv_close(alStack_120,0);
    pcStack_138 = (code *)0x1b5e97;
    uVar5 = uv_default_loop();
    pcStack_138 = (code *)0x1b5ea1;
    iVar3 = uv_run(uVar5,0);
    lStack_130 = (long)iVar3;
    lStack_128 = 0;
    if (lStack_130 != 0) goto LAB_001b5f72;
    pcStack_138 = (code *)0x1b5ec6;
    iVar3 = close(uVar2);
    lStack_130 = (long)iVar3;
    lStack_128 = 0;
    if (lStack_130 != 0) goto LAB_001b5f7f;
    pcStack_138 = (code *)0x1b5ee9;
    uVar6 = uv_default_loop();
    pcStack_138 = (code *)0x1b5efd;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_138 = (code *)0x1b5f07;
    uv_run(uVar6,0);
    lStack_130 = 0;
    pcStack_138 = (code *)0x1b5f14;
    uVar5 = uv_default_loop();
    pcStack_138 = (code *)0x1b5f1c;
    iVar3 = uv_loop_close(uVar5);
    lStack_128 = (long)iVar3;
    if (lStack_130 == lStack_128) {
      pcStack_138 = (code *)0x1b5f33;
      uv_library_shutdown();
      return 0;
    }
  }
  plVar14 = &lStack_128;
  pcStack_138 = create_bound_socket;
  run_test_poll_nested_epoll_cold_5();
  pcStack_170 = (code *)0x1b5fb9;
  puStack_148 = (undefined1 *)plVar15;
  plStack_140 = plVar14;
  pcStack_138 = (code *)uVar6;
  uVar2 = socket(2,1,0);
  lStack_158 = (long)(int)uVar2;
  uStack_160 = 0;
  if (lStack_158 < 0) {
    pcStack_170 = (code *)0x1b6059;
    create_bound_socket_cold_3();
LAB_001b6059:
    pcStack_170 = (code *)0x1b6068;
    create_bound_socket_cold_1();
  }
  else {
    uStack_14c = 1;
    pcStack_170 = (code *)0x1b5ff9;
    iVar3 = setsockopt(uVar2,1,2,&uStack_14c,4);
    lStack_158 = (long)iVar3;
    uStack_160 = 0;
    if (lStack_158 != 0) goto LAB_001b6059;
    pcStack_170 = (code *)0x1b6026;
    iVar3 = bind(uVar2,(sockaddr *)&puStack_148,0x10);
    lStack_158 = (long)iVar3;
    uStack_160 = 0;
    if (lStack_158 == 0) {
      return uVar2;
    }
  }
  plVar15 = &lStack_158;
  pcStack_170 = server_poll_cb;
  create_bound_socket_cold_2();
  __n = (code *)*plVar15;
  sStack_184 = 0x10;
  pcStack_170 = (code *)(ulong)uVar2;
  iVar3 = accept(*(int *)((long)__n + 0x80),&sStack_180,&sStack_184);
  lStack_190 = (long)iVar3;
  uStack_198 = 0;
  if (lStack_190 < 0) {
    server_poll_cb_cold_2();
  }
  else {
    pcVar7 = create_connection_context(iVar3,1);
    pcVar7->events = 7;
    iVar3 = uv_poll_start(pcVar7,7,connection_poll_cb);
    lStack_190 = (long)iVar3;
    uStack_198 = 0;
    if (lStack_190 == 0) {
      iVar3 = *(int *)((long)__n + 0x84) + 1;
      *(int *)((long)__n + 0x84) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)((long)__n + 0x80));
        iVar3 = uv_close(__n,server_close_cb);
      }
      return iVar3;
    }
  }
  plVar15 = &lStack_190;
  uVar13 = SUB84(&uStack_198,0);
  server_poll_cb_cold_1();
  iVar3 = (int)&uStack_1c8;
  ppppplStack_1b8 = (long *****)__n;
  pppppplVar8 = (long ******)malloc(0x130);
  if (pppppplVar8 == (long ******)0x0) {
    create_connection_context_cold_3();
LAB_001b6216:
    create_connection_context_cold_1();
  }
  else {
    *(int *)(pppppplVar8 + 0x1f) = (int)plVar15;
    *(undefined4 *)(pppppplVar8 + 0x22) = uVar13;
    pppppplVar8[0x20] = (long *****)0x0;
    pppppplVar8[0x21] = (long *****)0x0;
    *(undefined8 *)((long)pppppplVar8 + 0x114) = 0;
    *(undefined8 *)((long)pppppplVar8 + 0x11c) = 0;
    *(undefined8 *)((long)pppppplVar8 + 0x124) = 0;
    uVar5 = uv_default_loop();
    iVar4 = uv_poll_init(uVar5,pppppplVar8,(ulong)plVar15 & 0xffffffff);
    *(int *)((long)pppppplVar8 + 0x114) = *(int *)((long)pppppplVar8 + 0x114) + 1;
    *pppppplVar8 = (long *****)pppppplVar8;
    pppplStack_1c0 = (long ****)(long)iVar4;
    uStack_1c8 = 0;
    __n = (code *)pppppplVar8;
    if ((long *****)pppplStack_1c0 != (long *****)0x0) goto LAB_001b6216;
    uVar5 = uv_default_loop();
    iVar4 = uv_timer_init(uVar5,pppppplVar8 + 0x10);
    *(int *)((long)pppppplVar8 + 0x114) = *(int *)((long)pppppplVar8 + 0x114) + 1;
    pppppplVar8[0x10] = (long *****)pppppplVar8;
    pppplStack_1c0 = (long ****)(long)iVar4;
    uStack_1c8 = 0;
    if ((long *****)pppplStack_1c0 == (long *****)0x0) {
      return (int)pppppplVar8;
    }
  }
  pppppplVar8 = (long ******)&pppplStack_1c0;
  create_connection_context_cold_2();
  pppppplVar1 = (long ******)*pppppplVar8;
  ppppplStack_208 = (long *****)(long)iVar3;
  ppppplStack_210 = (long *****)0x0;
  ppppplStack_1f8 = (long *****)__n;
  if ((long ******)ppppplStack_208 == (long ******)0x0) {
    uVar2 = *(uint *)((long)pppppplVar1 + 0x124);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_001b68d6;
    if ((~uVar2 & extraout_EDX) == 0) {
      pppppplVar18 = pppppplVar8;
      if ((extraout_EDX & 1) != 0) goto LAB_001b63cb;
switchD_001b640c_caseD_4:
      if ((extraout_EDX & 2) != 0) {
        if ((pppppplVar1[0x21] < (long *****)0x10000) &&
           ((test_mode != '\x01' || (*(int *)(pppppplVar1 + 0x22) == 0)))) {
          pcStack_218 = (code *)0x1b64ac;
          iVar3 = rand();
          pcVar12 = (char *)__n;
          switch(iVar3 % 7) {
          case 0:
          case 1:
            pppppplVar19 = (long ******)0x67;
            if ((long ******)(0x10000 - (long)pppppplVar1[0x21]) < (long ******)0x67) {
              pppppplVar19 = (long ******)(0x10000 - (long)pppppplVar1[0x21]);
            }
            ppppplStack_210 = (long *****)0x0;
            ppppplStack_208 = (long *****)pppppplVar19;
            ppppplStack_200 = (long *****)pppppplVar18;
            if ((long)pppppplVar19 < 1) goto LAB_001b6919;
            do {
              pppppplVar8 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
              pcStack_218 = (code *)0x1b6540;
              pcVar12 = (char *)send(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_2,
                                     (size_t)pppppplVar19,0);
              uVar11 = (uint)pcVar12;
              if (uVar11 != 0xffffffff) break;
              pcStack_218 = (code *)0x1b654d;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            pppppplVar18 = (long ******)ppppplStack_200;
            if ((int)uVar11 < 0) {
              pcStack_218 = (code *)0x1b6845;
              piVar10 = __errno_location();
              __n = (code *)pcVar12;
              if ((*piVar10 != 0xb) && (*piVar10 != 0x73)) {
                pcStack_218 = (code *)0x1b6856;
                connection_poll_cb_cold_15();
                goto LAB_001b6856;
              }
LAB_001b6870:
              spurious_writable_wakeups = spurious_writable_wakeups + 1;
            }
            else {
              __n = (code *)(ulong)(uVar11 & 0x7fffffff);
              ppppplStack_210 = (long *****)0x0;
              ppppplStack_208 = (long *****)__n;
              if ((long ******)__n == (long ******)0x0) goto LAB_001b6933;
              pppppplVar1[0x21] = (long *****)((long)pppppplVar1[0x21] + (long)__n);
              valid_writable_wakeups = valid_writable_wakeups + 1;
            }
            break;
          case 2:
          case 3:
            pppppplVar19 = (long ******)(0x10000 - (long)pppppplVar1[0x21]);
            if ((long ******)0x4d1 < pppppplVar19) {
              pppppplVar19 = (long ******)0x4d2;
            }
            ppppplStack_210 = (long *****)0x0;
            ppppplStack_208 = (long *****)pppppplVar19;
            ppppplStack_200 = (long *****)pppppplVar18;
            if ((long)pppppplVar19 < 1) goto LAB_001b6926;
            pcVar12 = connection_poll_cb::buffer_3;
            do {
              pppppplVar8 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
              pcStack_218 = (code *)0x1b66bb;
              sVar9 = send(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_3,
                           (size_t)pppppplVar19,0);
              uVar11 = (uint)sVar9;
              if (uVar11 != 0xffffffff) break;
              pcStack_218 = (code *)0x1b66c9;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            if ((int)uVar11 < 0) {
LAB_001b6856:
              pcStack_218 = (code *)0x1b685b;
              piVar10 = __errno_location();
              __n = (code *)pcVar12;
              pppppplVar18 = (long ******)ppppplStack_200;
              if ((*piVar10 == 0xb) || (*piVar10 == 0x73)) goto LAB_001b6870;
              goto LAB_001b6952;
            }
            ppppplStack_208 = (long *****)(ulong)(uVar11 & 0x7fffffff);
            ppppplStack_210 = (long *****)0x0;
            __n = (code *)pcVar12;
            if ((long ******)ppppplStack_208 == (long ******)0x0) goto LAB_001b6940;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            ppppplVar17 = (long *****)((long)ppppplStack_208 + (long)pppppplVar1[0x21]);
            pppppplVar1[0x21] = ppppplVar17;
            while (pppppplVar18 = (long ******)ppppplStack_200, ppppplVar17 < (long *****)0x10000) {
              __n = (code *)(0x10000 - (long)ppppplVar17);
              if (ppppplVar17 < (long *****)0xfb2f) {
                __n = (code *)0x4d2;
              }
              ppppplStack_210 = (long *****)0x0;
              ppppplStack_208 = (long *****)__n;
              if ((long)__n < 1) goto LAB_001b68fa;
              do {
                pcStack_218 = (code *)0x1b676f;
                sVar9 = send(*(int *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_3,(size_t)__n,0
                            );
                uVar11 = (uint)sVar9;
                if (uVar11 != 0xffffffff) break;
                pcStack_218 = (code *)0x1b677d;
                piVar10 = __errno_location();
              } while (*piVar10 == 4);
              if (uVar11 == 0) {
LAB_001b68c4:
                pcStack_218 = (code *)0x1b68c9;
                connection_poll_cb_cold_10();
                goto LAB_001b68c9;
              }
              if ((int)uVar11 < 0) {
                pcStack_218 = (code *)0x1b68a6;
                piVar10 = __errno_location();
                pppppplVar18 = (long ******)ppppplStack_200;
                if ((*piVar10 != 0xb) && (*piVar10 != 0x73)) {
                  pcStack_218 = (code *)0x1b68c4;
                  connection_poll_cb_cold_11();
                  goto LAB_001b68c4;
                }
                break;
              }
              ppppplVar17 = (long *****)((ulong)(uVar11 & 0x7fffffff) + (long)pppppplVar1[0x21]);
              pppppplVar1[0x21] = ppppplVar17;
            }
            break;
          case 4:
            break;
          case 5:
            uVar2 = uVar2 & 0xfffffffd;
            __n = (code *)(pppppplVar1 + 0x10);
            pcStack_218 = (code *)0x1b67f8;
            iVar3 = uv_is_active(__n);
            if (iVar3 == 0) {
              *(undefined4 *)(pppppplVar1 + 0x25) = 2;
              pcStack_218 = (code *)0x1b689c;
              uv_timer_start(__n,delay_timer_cb,100,0);
            }
            else {
              *(byte *)(pppppplVar1 + 0x25) = (byte)*(code *)(pppppplVar1 + 0x25) | 2;
            }
            break;
          case 6:
            __n = connection_poll_cb;
            pcStack_218 = (code *)0x1b6820;
            uv_poll_start(pppppplVar1,1,connection_poll_cb);
            pcStack_218 = (code *)0x1b6830;
            uv_poll_start(pppppplVar1,2,connection_poll_cb);
            *(undefined4 *)((long)pppppplVar1 + 0x124) = 2;
            break;
          default:
            goto switchD_001b64e8_default;
          }
        }
        else {
          pcStack_218 = (code *)0x1b62cb;
          iVar3 = shutdown(*(int *)(pppppplVar1 + 0x1f),1);
          ppppplStack_208 = (long *****)(long)iVar3;
          ppppplStack_210 = (long *****)0x0;
          if ((long ******)ppppplStack_208 != (long ******)0x0) goto LAB_001b68ed;
          *(undefined4 *)((long)pppppplVar1 + 0x11c) = 1;
          uVar2 = uVar2 & 0xfffffffd;
          ppppplStack_208 = (long *****)(long ******)0x0;
        }
      }
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(pppppplVar1 + 0x24) = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)(pppppplVar1 + 0x23) == 0) || (*(int *)((long)pppppplVar1 + 0x11c) == 0)) ||
         (*(int *)(pppppplVar1 + 0x24) == 0)) {
        if (uVar2 != *(uint *)((long)pppppplVar1 + 0x124)) {
          *(uint *)((long)pppppplVar1 + 0x124) = uVar2;
          pcStack_218 = (code *)0x1b638a;
          uv_poll_start(pppppplVar18,uVar2,connection_poll_cb);
        }
      }
      else {
        pcStack_218 = (code *)0x1b633b;
        close_socket(*(uv_os_sock_t *)(pppppplVar1 + 0x1f));
        __n = connection_close_cb;
        pcStack_218 = (code *)0x1b634d;
        uv_close(pppppplVar1,connection_close_cb);
        pcStack_218 = (code *)0x1b635c;
        uv_close(pppppplVar1 + 0x10,connection_close_cb);
        *(undefined4 *)((long)pppppplVar1 + 0x124) = 0;
      }
      if (*(int *)((long)pppppplVar1 + 0x124) == 0) {
        pcStack_218 = (code *)0x1b647a;
        iVar3 = uv_is_active(pppppplVar18);
        ppppplStack_208 = (long *****)(long)iVar3;
        ppppplStack_210 = (long *****)0x0;
        if ((long ******)ppppplStack_208 == (long ******)0x0) {
LAB_001b6498:
          return (int)ppppplStack_208;
        }
        goto LAB_001b68e0;
      }
      ppppplStack_208 = (long *****)0x1;
      pcStack_218 = (code *)0x1b63a9;
      iVar3 = uv_is_active(pppppplVar18);
      ppppplStack_210 = (long *****)(long)iVar3;
      if (ppppplStack_208 == ppppplStack_210) goto LAB_001b6498;
      pppppplVar8 = &ppppplStack_208;
      pcStack_218 = (code *)0x1b63cb;
      connection_poll_cb_cold_17();
LAB_001b63cb:
      pcStack_218 = (code *)0x1b63d0;
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        do {
          pppppplVar8 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
          pcStack_218 = (code *)0x1b642b;
          sVar9 = recv(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer,0x4a,0);
          iVar3 = (int)sVar9;
          if (iVar3 != -1) break;
          pcStack_218 = (code *)0x1b6439;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        ppppplStack_208 = (long *****)(long)iVar3;
        ppppplStack_210 = (long *****)0x0;
        __n = (code *)connection_poll_cb::buffer;
        if ((long)ppppplStack_208 < 0) goto LAB_001b6907;
        if (iVar3 < 1) goto LAB_001b65f5;
        pppppplVar1[0x20] = (long *****)((long)pppppplVar1[0x20] + (long)ppppplStack_208);
        goto switchD_001b640c_caseD_4;
      case 2:
      case 3:
LAB_001b659a:
        pppppplVar8 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
        pcStack_218 = (code *)0x1b65b0;
        __n = (code *)recv(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_1,0x3a3,0);
        uVar11 = (uint)__n;
        if (uVar11 == 0xffffffff) goto code_r0x001b65b8;
        goto LAB_001b65c2;
      case 4:
        goto switchD_001b640c_caseD_4;
      case 5:
        uVar2 = uVar2 & 0xfffffffe;
        __n = (code *)(pppppplVar1 + 0x10);
        pcStack_218 = (code *)0x1b661a;
        pppppplVar8 = (long ******)__n;
        iVar3 = uv_is_active();
        if (iVar3 == 0) {
          *(undefined4 *)(pppppplVar1 + 0x25) = 1;
          pcStack_218 = (code *)0x1b67e1;
          pppppplVar8 = (long ******)__n;
          uv_timer_start(__n,delay_timer_cb,10,0);
        }
        else {
          *(byte *)(pppppplVar1 + 0x25) = (byte)*(code *)(pppppplVar1 + 0x25) | 1;
        }
        goto switchD_001b640c_caseD_4;
      case 6:
        __n = connection_poll_cb;
        pcStack_218 = (code *)0x1b6646;
        uv_poll_start(pppppplVar1,2,connection_poll_cb);
        pcStack_218 = (code *)0x1b6656;
        pppppplVar8 = pppppplVar1;
        uv_poll_start(pppppplVar1,1,connection_poll_cb);
        *(undefined4 *)((long)pppppplVar1 + 0x124) = 1;
        goto switchD_001b640c_caseD_4;
      default:
        goto switchD_001b640c_default;
      }
    }
  }
  else {
LAB_001b68c9:
    pcStack_218 = (code *)0x1b68d6;
    connection_poll_cb_cold_1();
LAB_001b68d6:
    pcStack_218 = (code *)0x1b68db;
    connection_poll_cb_cold_19();
  }
  pcStack_218 = (code *)0x1b68e0;
  connection_poll_cb_cold_2();
LAB_001b68e0:
  pcStack_218 = (code *)0x1b68ed;
  connection_poll_cb_cold_18();
LAB_001b68ed:
  pcStack_218 = (code *)0x1b68fa;
  connection_poll_cb_cold_6();
LAB_001b68fa:
  pcStack_218 = (code *)0x1b6907;
  connection_poll_cb_cold_9();
LAB_001b6907:
  pcStack_218 = (code *)0x1b6914;
  connection_poll_cb_cold_4();
switchD_001b640c_default:
  pcStack_218 = (code *)0x1b6919;
  connection_poll_cb_cold_5();
LAB_001b6919:
  pcStack_218 = (code *)0x1b6926;
  connection_poll_cb_cold_13();
LAB_001b6926:
  pcStack_218 = (code *)0x1b6933;
  connection_poll_cb_cold_7();
LAB_001b6933:
  pcStack_218 = (code *)0x1b6940;
  connection_poll_cb_cold_14();
LAB_001b6940:
  pppppplVar8 = &ppppplStack_208;
  pcStack_218 = (code *)0x1b694d;
  connection_poll_cb_cold_8();
  pcVar12 = (char *)__n;
switchD_001b64e8_default:
  pcStack_218 = (code *)0x1b6952;
  connection_poll_cb_cold_16();
LAB_001b6952:
  pcStack_218 = close_socket;
  connection_poll_cb_cold_12();
  ppppplStack_220 = (long *****)0x1b695d;
  pcStack_218._0_4_ = extraout_EAX;
  iVar3 = close((int)pppppplVar8);
  if (iVar3 == 0) {
    return (int)pcStack_218;
  }
  ppppplStack_220 = (long *****)0x1b6966;
  piVar10 = __errno_location();
  if (*piVar10 == 0x68) {
    return (int)pcStack_218;
  }
  ppppplStack_220 = (long *****)delay_timer_cb;
  close_socket_cold_1();
  ppppplVar17 = *pppppplVar8;
  pcStack_238 = (code *)0x1b697f;
  ppppplStack_220 = (long *****)pcVar12;
  iVar3 = uv_is_active();
  lStack_228 = (long)iVar3;
  uStack_230 = 0;
  if (lStack_228 == 0) {
    if (*(uint *)(ppppplVar17 + 0x25) == 0) goto LAB_001b69f5;
    uVar2 = *(uint *)(ppppplVar17 + 0x25) | *(uint *)((long)ppppplVar17 + 0x124);
    *(uint *)((long)ppppplVar17 + 0x124) = uVar2;
    *(undefined4 *)(ppppplVar17 + 0x25) = 0;
    pcStack_238 = (code *)0x1b69c8;
    iVar3 = uv_poll_start(ppppplVar17,uVar2,connection_poll_cb);
    lStack_228 = (long)iVar3;
    uStack_230 = 0;
    if (lStack_228 == 0) {
      return iVar3;
    }
  }
  else {
    pcStack_238 = (code *)0x1b69f5;
    delay_timer_cb_cold_1();
LAB_001b69f5:
    pcStack_238 = (code *)0x1b69fa;
    delay_timer_cb_cold_3();
  }
  plVar15 = &lStack_228;
  pcStack_238 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar16 = (code **)*plVar15;
  piVar10 = (int *)((long)ppcVar16 + 0x114);
  *piVar10 = *piVar10 + -1;
  if (*piVar10 != 0) {
    return extraout_EAX_00;
  }
  if ((test_mode == '\x01') && (*(int *)(ppcVar16 + 0x22) == 0)) {
    pcStack_238 = ppcVar16[0x20];
    if (pcStack_238 != (code *)0x0) {
      connection_close_cb_cold_2();
LAB_001b6af8:
      connection_close_cb_cold_1();
      goto LAB_001b6b07;
    }
  }
  else {
    pcStack_238 = ppcVar16[0x20];
    if (pcStack_238 != (code *)0x10000) goto LAB_001b6af8;
  }
  if ((test_mode != '\0') && (*(int *)(ppcVar16 + 0x22) != 0)) {
    pcStack_238 = ppcVar16[0x21];
    if (pcStack_238 == (code *)0x0) goto LAB_001b6ab5;
    ppcVar16 = &pcStack_238;
    connection_close_cb_cold_3();
  }
  pcStack_238 = ppcVar16[0x21];
  if (pcStack_238 != (code *)0x10000) {
LAB_001b6b07:
    ppcVar16 = &pcStack_238;
    connection_close_cb_cold_4();
    free(*ppcVar16);
    return extraout_EAX_02;
  }
LAB_001b6ab5:
  closed_connections = closed_connections + 1;
  free(ppcVar16);
  return extraout_EAX_01;
code_r0x001b65b8:
  pcStack_218 = (code *)0x1b65bd;
  piVar10 = __errno_location();
  if (*piVar10 == 4) goto LAB_001b659a;
LAB_001b65c2:
  if (0 < (int)uVar11) {
    pppppplVar1[0x20] = (long *****)((long)pppppplVar1[0x20] + (ulong)(uVar11 & 0x7fffffff));
    goto LAB_001b659a;
  }
  if (uVar11 != 0) {
    pcStack_218 = (code *)0x1b65dc;
    piVar10 = __errno_location();
    if ((*piVar10 == 0xb) || (*piVar10 == 0x73)) goto switchD_001b640c_caseD_4;
    pcStack_218 = (code *)0x1b65f5;
    connection_poll_cb_cold_3();
  }
LAB_001b65f5:
  *(undefined4 *)(pppppplVar1 + 0x23) = 1;
  uVar2 = uVar2 & 0xfffffffe;
  goto switchD_001b640c_caseD_4;
}

Assistant:

TEST_IMPL(poll_bad_fdtype) {
#if !defined(__DragonFly__) && !defined(__FreeBSD__) && !defined(__sun) && \
    !defined(_AIX) && !defined(__MVS__) && \
    !defined(__OpenBSD__) && !defined(__CYGWIN__) && !defined(__MSYS__) && \
    !defined(__NetBSD__)
  uv_poll_t poll_handle;
  uv_os_fd_t handle;
  int fd;

#if defined(_WIN32)
  fd = _open("test/fixtures/empty_file", UV_FS_O_RDONLY);
#else
  fd = open(".", UV_FS_O_RDONLY);
#endif
  ASSERT_NE(fd, -1);
  handle = uv_get_osfhandle(fd);
  /* This uses a bad cast on windows to allow passing an invalid SOCKET. */
  ASSERT_NE(0, uv_poll_init(uv_default_loop(), &poll_handle, (uv_os_sock_t) handle));
  ASSERT_OK(close(fd));
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}